

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_sde.c
# Opt level: O3

void beltSDEStepD(void *buf,size_t count,octet *iv,void *state)

{
  memCopy((octet *)((long)state + 0x48),iv,0x10);
  beltBlockEncr((octet *)((long)state + 0x48),(u32 *)state);
  *(ulong *)buf = *buf ^ *(ulong *)((long)state + 0x48);
  *(ulong *)((long)buf + 8) = *(ulong *)((long)buf + 8) ^ *(ulong *)((long)state + 0x50);
  beltWBLStepD(buf,count,state);
  *(ulong *)buf = *buf ^ *(ulong *)((long)state + 0x48);
  *(ulong *)((long)buf + 8) = *(ulong *)((long)buf + 8) ^ *(ulong *)((long)state + 0x50);
  return;
}

Assistant:

void beltSDEStepD(void* buf, size_t count, const octet iv[16], void* state)
{
	belt_sde_st* st = (belt_sde_st*)state;
	ASSERT(count % 16 == 0 && count >= 32);
	ASSERT(memIsDisjoint2(buf, count, state, beltSDE_keep()));
	ASSERT(memIsValid(iv, 16));
	// зашифровать синхропосылку
	memCopy(st->s, iv, 16);
	beltBlockEncr(st->s, st->wbl->key);
	// каскад XEX
	beltBlockXor2(buf, st->s);
	beltWBLStepD(buf, count, st->wbl);
	beltBlockXor2(buf, st->s);
}